

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tty.c
# Opt level: O0

uv_handle_type uv_guess_handle(uv_file file)

{
  int iVar1;
  int local_128 [2];
  int type;
  socklen_t len;
  stat s;
  sockaddr_storage ss;
  uv_file file_local;
  
  if (file < 0) {
    ss.__ss_align._4_4_ = UV_UNKNOWN_HANDLE;
  }
  else {
    iVar1 = isatty(file);
    if (iVar1 == 0) {
      iVar1 = fstat(file,(stat *)&type);
      if (iVar1 == 0) {
        if (((uint)s.st_nlink & 0xf000) == 0x8000) {
          ss.__ss_align._4_4_ = UV_FILE;
        }
        else if (((uint)s.st_nlink & 0xf000) == 0x2000) {
          ss.__ss_align._4_4_ = UV_FILE;
        }
        else if (((uint)s.st_nlink & 0xf000) == 0x1000) {
          ss.__ss_align._4_4_ = UV_NAMED_PIPE;
        }
        else if (((uint)s.st_nlink & 0xf000) == 0xc000) {
          local_128[1] = 0x80;
          iVar1 = getsockname(file,(sockaddr *)(s.__glibc_reserved + 2),(socklen_t *)(local_128 + 1)
                             );
          if (iVar1 == 0) {
            local_128[1] = 4;
            iVar1 = getsockopt(file,1,3,local_128,(socklen_t *)(local_128 + 1));
            if (iVar1 == 0) {
              if ((local_128[0] == 2) &&
                 (((short)s.__glibc_reserved[2] == 2 || ((short)s.__glibc_reserved[2] == 10)))) {
                ss.__ss_align._4_4_ = UV_UDP;
              }
              else {
                if (local_128[0] == 1) {
                  if (((short)s.__glibc_reserved[2] == 2) || ((short)s.__glibc_reserved[2] == 10)) {
                    return UV_TCP;
                  }
                  if ((short)s.__glibc_reserved[2] == 1) {
                    return UV_NAMED_PIPE;
                  }
                }
                ss.__ss_align._4_4_ = UV_UNKNOWN_HANDLE;
              }
            }
            else {
              ss.__ss_align._4_4_ = UV_UNKNOWN_HANDLE;
            }
          }
          else {
            ss.__ss_align._4_4_ = UV_UNKNOWN_HANDLE;
          }
        }
        else {
          ss.__ss_align._4_4_ = UV_UNKNOWN_HANDLE;
        }
      }
      else {
        ss.__ss_align._4_4_ = UV_UNKNOWN_HANDLE;
      }
    }
    else {
      ss.__ss_align._4_4_ = UV_TTY;
    }
  }
  return ss.__ss_align._4_4_;
}

Assistant:

uv_handle_type uv_guess_handle(uv_file file) {
  struct sockaddr_storage ss;
  struct stat s;
  socklen_t len;
  int type;

  if (file < 0)
    return UV_UNKNOWN_HANDLE;

  if (isatty(file))
    return UV_TTY;

  if (fstat(file, &s)) {
#if defined(__PASE__)
    /* On ibmi receiving RST from TCP instead of FIN immediately puts fd into
     * an error state. fstat will return EINVAL, getsockname will also return
     * EINVAL, even if sockaddr_storage is valid. (If file does not refer to a
     * socket, ENOTSOCK is returned instead.)
     * In such cases, we will permit the user to open the connection as uv_tcp
     * still, so that the user can get immediately notified of the error in
     * their read callback and close this fd.
     */
    len = sizeof(ss);
    if (getsockname(file, (struct sockaddr*) &ss, &len)) {
      if (errno == EINVAL)
        return UV_TCP;
    }
#endif
    return UV_UNKNOWN_HANDLE;
  }

  if (S_ISREG(s.st_mode))
    return UV_FILE;

  if (S_ISCHR(s.st_mode))
    return UV_FILE;  /* XXX UV_NAMED_PIPE? */

  if (S_ISFIFO(s.st_mode))
    return UV_NAMED_PIPE;

  if (!S_ISSOCK(s.st_mode))
    return UV_UNKNOWN_HANDLE;

  len = sizeof(ss);
  if (getsockname(file, (struct sockaddr*) &ss, &len)) {
#if defined(_AIX)
    /* On aix receiving RST from TCP instead of FIN immediately puts fd into
     * an error state. In such case getsockname will return EINVAL, even if
     * sockaddr_storage is valid.
     * In such cases, we will permit the user to open the connection as uv_tcp
     * still, so that the user can get immediately notified of the error in
     * their read callback and close this fd.
     */
    if (errno == EINVAL) {
      return UV_TCP;
    }
#endif
    return UV_UNKNOWN_HANDLE;
  }

  len = sizeof(type);
  if (getsockopt(file, SOL_SOCKET, SO_TYPE, &type, &len))
    return UV_UNKNOWN_HANDLE;

  if (type == SOCK_DGRAM)
    if (ss.ss_family == AF_INET || ss.ss_family == AF_INET6)
      return UV_UDP;

  if (type == SOCK_STREAM) {
#if defined(_AIX) || defined(__DragonFly__)
    /* on AIX/DragonFly the getsockname call returns an empty sa structure
     * for sockets of type AF_UNIX.  For all other types it will
     * return a properly filled in structure.
     */
    if (len == 0)
      return UV_NAMED_PIPE;
#endif /* defined(_AIX) || defined(__DragonFly__) */

    if (ss.ss_family == AF_INET || ss.ss_family == AF_INET6)
      return UV_TCP;
    if (ss.ss_family == AF_UNIX)
      return UV_NAMED_PIPE;
  }

  return UV_UNKNOWN_HANDLE;
}